

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

QModelIndex * __thiscall
QColumnView::moveCursor
          (QModelIndex *__return_storage_ptr__,QColumnView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  bool bVar1;
  char cVar2;
  QAbstractItemModel *pQVar3;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QModelIndex local_78;
  QModelIndex local_60;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_0050aac7;
  }
  local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(&local_48,(QAbstractItemView *)this);
  bVar1 = QWidget::isRightToLeft((QWidget *)this);
  if (bVar1) {
    if (cursorAction == MoveLeft) {
LAB_0050aa43:
      pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
      cVar2 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,&local_48);
      if (cVar2 == '\0') {
        QModelIndex::sibling(__return_storage_ptr__,&local_48,local_48.r + 1,local_48.c);
      }
      else {
        pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
        (**(code **)(*(long *)pQVar3 + 0x60))(__return_storage_ptr__,pQVar3,0,0,&local_48);
      }
    }
    else {
      if (cursorAction == MoveRight) goto LAB_0050a9d4;
LAB_0050a990:
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
    }
  }
  else {
    if (cursorAction == MoveRight) goto LAB_0050aa43;
    if (cursorAction != MoveLeft) goto LAB_0050a990;
LAB_0050a9d4:
    QModelIndex::parent(&local_60,&local_48);
    if (((-1 < local_60.r) && (-1 < local_60.c)) && (local_60.m.ptr != (QAbstractItemModel *)0x0)) {
      QModelIndex::parent(&local_78,&local_48);
      QAbstractItemView::rootIndex(&local_90,(QAbstractItemView *)this);
      bVar1 = ::operator!=(&local_78,&local_90);
      if (bVar1) {
        QModelIndex::parent(__return_storage_ptr__,&local_48);
        goto LAB_0050aaa7;
      }
    }
    (__return_storage_ptr__->m).ptr = local_48.m.ptr;
    __return_storage_ptr__->r = local_48.r;
    __return_storage_ptr__->c = local_48.c;
    __return_storage_ptr__->i = local_48.i;
  }
LAB_0050aaa7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0050aac7:
  __stack_chk_fail();
}

Assistant:

QModelIndex QColumnView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    // the child views which have focus get to deal with this first and if
    // they don't accept it then it comes up this view and we only grip left/right
    Q_UNUSED(modifiers);
    if (!model())
        return QModelIndex();

    QModelIndex current = currentIndex();
    if (isRightToLeft()) {
        if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
        else if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
    }
    switch (cursorAction) {
    case MoveLeft:
        if (current.parent().isValid() && current.parent() != rootIndex())
            return (current.parent());
        else
            return current;

    case MoveRight:
        if (model()->hasChildren(current))
            return model()->index(0, 0, current);
        else
            return current.sibling(current.row() + 1, current.column());

    default:
        break;
    }

    return QModelIndex();
}